

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_resolver_test.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::FeatureResolverLifetimesTest_ValueSupportValid_Test::TestBody
          (FeatureResolverLifetimesTest_ValueSupportValid_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_110;
  Message local_108;
  char local_f9;
  undefined1 local_f8 [8];
  AssertionResult gtest_ar_1;
  Message local_e0;
  char local_d1;
  undefined1 local_d0 [8];
  AssertionResult gtest_ar;
  undefined1 local_b0 [8];
  ValidationResults results;
  ParseTextOrDie local_70;
  undefined1 local_60 [8];
  FeatureSet features;
  FeatureResolverLifetimesTest_ValueSupportValid_Test *this_local;
  
  features.field_0._56_8_ = this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)
             &results.warnings.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             "\n    [pb.test] { value_lifetime_feature: VALUE_LIFETIME_SUPPORT }\n  ");
  ParseTextOrDie::ParseTextOrDie(&local_70,stack0xffffffffffffff80);
  ParseTextOrDie::operator_cast_to_FeatureSet((FeatureSet *)local_60,&local_70);
  FeatureResolver::ValidateFeatureLifetimes
            ((ValidationResults *)local_b0,EDITION_99997_TEST_ONLY,(FeatureSet *)local_60,
             (Descriptor *)0x0);
  testing::IsEmpty();
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::IsEmptyMatcher>>
            ();
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::IsEmptyMatcher>>::
  operator()(local_d0,&local_d1,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)"results.errors");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d0);
  if (!bVar1) {
    testing::Message::Message(&local_e0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/feature_resolver_test.cc"
               ,0x2d0,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d0);
  testing::IsEmpty();
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::IsEmptyMatcher>>
            ();
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::IsEmptyMatcher>>::
  operator()(local_f8,&local_f9,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)"results.warnings");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f8);
  if (!bVar1) {
    testing::Message::Message(&local_108);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_f8);
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/feature_resolver_test.cc"
               ,0x2d1,pcVar2);
    testing::internal::AssertHelper::operator=(&local_110,&local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    testing::Message::~Message(&local_108);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f8);
  FeatureResolver::ValidationResults::~ValidationResults((ValidationResults *)local_b0);
  FeatureSet::~FeatureSet((FeatureSet *)local_60);
  return;
}

Assistant:

TEST(FeatureResolverLifetimesTest, ValueSupportValid) {
  FeatureSet features = ParseTextOrDie(R"pb(
    [pb.test] { value_lifetime_feature: VALUE_LIFETIME_SUPPORT }
  )pb");
  auto results = FeatureResolver::ValidateFeatureLifetimes(
      EDITION_99997_TEST_ONLY, features, nullptr);
  EXPECT_THAT(results.errors, IsEmpty());
  EXPECT_THAT(results.warnings, IsEmpty());
}